

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_full_path.cpp
# Opt level: O3

void test_dump(void)

{
  ostream *poVar1;
  char *local_58;
  string local_50;
  string local_30;
  
  SpyingSerial::clear(&Serial);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/bblanchon[P]ArduinoTrace/extras/test/test_full_path.cpp"
  ;
  SpyingSerial::print<char_const*>(&Serial,&local_58);
  local_58 = ":21: answer = ";
  SpyingSerial::print<char_const*>(&Serial,&local_58);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&Serial.field_0x10,0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&Serial.field_0x10,"flush()\r\n",9);
  std::__cxx11::stringbuf::str();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,".+test_full_path.cpp:\\d+: answer = 42\r\nflush\\(\\)\r\n","");
  ASSERT_RE(&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_dump() {
  Serial.clear();
  int answer = 42;
  DUMP(answer);
  ASSERT_RE(Serial.log(),
            ".+test_full_path.cpp:\\d+: answer = 42\r\n"
            "flush\\(\\)\r\n");
}